

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

bool __thiscall cmQtAutoMocUic::SettingsFileWrite(cmQtAutoMocUic *this)

{
  bool bVar1;
  string *filename;
  string error;
  string content;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (((this->MocConst_).SettingsChanged != false) ||
     (bVar1 = true, (this->UicConst_).SettingsChanged == true)) {
    if ((this->Logger_).Verbosity_ != 0) {
      cmQtAutoGen::Quoted(&local_78,&this->SettingsFile_);
      std::operator+(&local_58,"Writing settings file ",&local_78);
      cmQtAutoGenerator::Logger::Info(&this->Logger_,GEN,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      std::__cxx11::string::~string((string *)&local_78);
    }
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = '\0';
    local_78._M_dataplus._M_p = (pointer)&local_58;
    SettingsFileWrite::anon_class_8_1_bc116759::operator()
              ((anon_class_8_1_bc116759 *)&local_78,"moc",&this->SettingsStringMoc_);
    SettingsFileWrite::anon_class_8_1_bc116759::operator()
              ((anon_class_8_1_bc116759 *)&local_78,"uic",&this->SettingsStringUic_);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    filename = &this->SettingsFile_;
    bVar1 = cmQtAutoGenerator::FileWrite(filename,&local_58,&local_78);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      bVar1 = true;
    }
    else {
      std::operator+(&local_38,"Settings file writing failed. ",&local_78);
      cmQtAutoGenerator::Logger::ErrorFile(&this->Logger_,GEN,filename,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      cmsys::SystemTools::RemoveFile(filename);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool cmQtAutoMocUic::SettingsFileWrite()
{
  // Only write if any setting changed
  if (MocConst().SettingsChanged || UicConst().SettingsChanged) {
    if (Log().Verbose()) {
      Log().Info(GenT::GEN, "Writing settings file " + Quoted(SettingsFile_));
    }
    // Compose settings file content
    std::string content;
    {
      auto SettingAppend = [&content](const char* key,
                                      std::string const& value) {
        if (!value.empty()) {
          content += key;
          content += ':';
          content += value;
          content += '\n';
        }
      };
      SettingAppend("moc", SettingsStringMoc_);
      SettingAppend("uic", SettingsStringUic_);
    }
    // Write settings file
    std::string error;
    if (!cmQtAutoGenerator::FileWrite(SettingsFile_, content, &error)) {
      Log().ErrorFile(GenT::GEN, SettingsFile_,
                      "Settings file writing failed. " + error);
      // Remove old settings file to trigger a full rebuild on the next run
      cmSystemTools::RemoveFile(SettingsFile_);
      return false;
    }
  }
  return true;
}